

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O0

int64_t __thiscall IntView<2>::getMax(IntView<2> *this)

{
  int iVar1;
  long in_RDI;
  int64_t v;
  
  iVar1 = IntVar::getMax((IntVar *)0x265fea);
  return (long)*(int *)(in_RDI + 8) * (long)iVar1;
}

Assistant:

int64_t getMax() const {
		int64_t v = (type & 1) != 0 ? -var->getMin() : var->getMax();
		if ((type & 2) != 0) {
			v *= a;
		}
		if ((type & 4) != 0) {
			v += b;
		}
		return v;
	}